

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvaxtpeek.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  char *__ptr;
  ulong uVar5;
  int s;
  size_t sStack_60;
  int32_t b;
  int32_t a;
  int cnum;
  uint32_t z [4];
  
  iVar3 = nva_init();
  if (iVar3 == 0) {
    cnum = 0;
    do {
      while (iVar3 = getopt(argc,argv,"c:"), iVar3 == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
    } while (iVar3 != -1);
    if (cnum < nva_cardsnum) {
      b = 4;
      if (_optind < argc) {
        __isoc99_sscanf(argv[_optind],"%x",&a);
        if (_optind + 1 < argc) {
          __isoc99_sscanf(argv[(long)_optind + 1],"%x",&b);
          iVar3 = b;
        }
        else {
          iVar3 = 4;
        }
        *(undefined4 *)((long)nva_cards[cnum]->bar0 + 0x1700) = 0x30;
        bVar2 = true;
        while (0 < iVar3) {
          bVar1 = false;
          for (uVar5 = 0; (uVar5 < 0x10 && ((long)uVar5 < (long)iVar3)); uVar5 = uVar5 + 4) {
            uVar4 = xt_rd32(cnum,a + (int)uVar5);
            *(uint32_t *)((long)z + uVar5) = uVar4;
            if (uVar4 != 0) {
              bVar1 = true;
            }
            iVar3 = b;
          }
          if (bVar1) {
            printf("%08x:",(ulong)(uint)a);
            for (uVar5 = 0; (uVar5 < 0x10 && ((long)uVar5 < (long)b)); uVar5 = uVar5 + 4) {
              printf(" %08x",(ulong)*(uint *)((long)z + uVar5));
            }
            putchar(10);
            bVar1 = true;
          }
          else {
            bVar1 = false;
            if (bVar2) {
              puts("...");
            }
          }
          bVar2 = bVar1;
          a = a + 0x10;
          b = b + -0x10;
          iVar3 = b;
        }
        return 0;
      }
      __ptr = "No address specified.\n";
      sStack_60 = 0x16;
    }
    else if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_60 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
      sStack_60 = 0xe;
    }
  }
  else {
    __ptr = "PCI init failure!\n";
    sStack_60 = 0x12;
  }
  fwrite(__ptr,sStack_60,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	nva_wr32(cnum, 0x1700, 0x30);
	int ls = 1;
	while (b > 0) {
		uint32_t z[4];
		int s = 0;
		for (i = 0; i < 16 && i < b; i+=4)
			if ((z[i/4] = xt_rd32(cnum, a+i))) s = 1;
		if (s) {
			ls = 1;
			printf ("%08x:", a);
			for (i = 0; i < 16 && i < b; i+=4) {
				printf (" %08x", z[i/4]);
			}
			printf ("\n");
		} else  {
			if (ls) printf ("...\n"), ls = 0;
		}
		a+=16;
		b-=16;
	}
	return 0;
}